

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::generalizedBiasForces
          (KinDynComputations *this,FreeFloatingGeneralizedTorques *generalizedBiasForces)

{
  FrameVelocityRepresentation FVar1;
  KinDynComputationsPrivateAttributes *pKVar2;
  KinDynComputationsPrivateAttributes *pKVar3;
  Twist *bodyFixedVel;
  Rotation *inertial_R_body;
  SpatialAcc *this_00;
  JointPosDoubleArray *pJVar4;
  Wrench *pWVar5;
  long lVar6;
  Transform *pTVar7;
  undefined1 local_a8 [56];
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Vector6 zeroBaseAcc;
  
  computeFwdKinematics(this);
  iDynTree::LinkWrenches::zero();
  VectorFixSize<6U>::zero(&zeroBaseAcc);
  pKVar2 = this->pimpl;
  FVar1 = pKVar2->m_frameVelRepr;
  if (FVar1 == INERTIAL_FIXED_REPRESENTATION) {
    pTVar7 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    convertInertialAccelerationToBodyFixedAcceleration((SpatialAcc *)local_a8,&zeroBaseAcc,pTVar7);
    pKVar2 = this->pimpl;
  }
  else {
    if (FVar1 == BODY_FIXED_REPRESENTATION) {
      local_70._0_8_ = &zeroBaseAcc;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      _set_noalias<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_a8,
                 (DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_70);
      fromEigen(&(pKVar2->m_invDynBaseAcc).super_SpatialMotionVector,
                (Matrix<double,_6,_1,_0,_6,_1> *)local_a8);
      goto LAB_00129ca0;
    }
    bodyFixedVel = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    inertial_R_body = (Rotation *)iDynTree::Transform::getRotation();
    convertMixedAccelerationToBodyFixedAcceleration
              ((SpatialAcc *)local_a8,&zeroBaseAcc,bodyFixedVel,inertial_R_body);
    pKVar2 = this->pimpl;
  }
  iDynTree::SpatialAcc::operator=(&pKVar2->m_invDynBaseAcc,(SpatialAcc *)local_a8);
LAB_00129ca0:
  pKVar2 = this->pimpl;
  this_00 = (SpatialAcc *)iDynTree::FreeFloatingAcc::baseAcc();
  iDynTree::SpatialAcc::operator=(this_00,&pKVar2->m_invDynBaseAcc);
  local_a8._0_8_ = &this->pimpl->m_invDynBaseAcc;
  local_a8._16_8_ = &this->pimpl->m_gravityAccInBaseLinkFrame;
  local_70._0_8_ = iDynTree::FreeFloatingAcc::baseAcc();
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            (&local_70,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_a8);
  iDynTree::FreeFloatingAcc::jointAcc();
  iDynTree::VectorDynSize::zero();
  pKVar2 = this->pimpl;
  iDynTree::ForwardAccKinematics
            (&pKVar2->m_robot_model,&pKVar2->m_traversal,&pKVar2->m_pos,&pKVar2->m_vel,
             &pKVar2->m_invDynGeneralizedProperAccs,&pKVar2->m_linkVel,
             &pKVar2->m_invDynLinkProperAccs);
  pKVar2 = this->pimpl;
  pJVar4 = (JointPosDoubleArray *)iDynTree::FreeFloatingPos::jointPos();
  pKVar3 = this->pimpl;
  iDynTree::RNEADynamicPhase
            (&pKVar2->m_robot_model,&pKVar2->m_traversal,pJVar4,&pKVar3->m_linkVel,
             &pKVar3->m_invDynLinkProperAccs,&pKVar3->m_invDynNetExtWrenches,
             &pKVar3->m_invDynInternalWrenches,generalizedBiasForces);
  pKVar2 = this->pimpl;
  pWVar5 = (Wrench *)iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
  pKVar3 = this->pimpl;
  iDynTree::Traversal::getBaseLink();
  lVar6 = iDynTree::Link::getIndex();
  pTVar7 = (Transform *)iDynTree::LinkPositions::operator()(&pKVar3->m_linkPos,lVar6);
  KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation
            ((Wrench *)local_a8,pKVar2,pWVar5,pTVar7);
  pWVar5 = (Wrench *)iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
  iDynTree::Wrench::operator=(pWVar5,(Wrench *)local_a8);
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_a8);
  return true;
}

Assistant:

bool KinDynComputations::generalizedBiasForces(FreeFloatingGeneralizedTorques & generalizedBiasForces)
{
    // Needed for using pimpl->m_linkVel
    this->computeFwdKinematics();

    // The external wrenches need to be set to zero
    pimpl->m_invDynNetExtWrenches.zero();

    // The base acceleration is "zero" in the chosen representation,
    // but the "zero" in mixed means non-zero in body-fixed, and we should account for that
    Vector6 zeroBaseAcc;
    zeroBaseAcc.zero();
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_invDynBaseAcc,toEigen(zeroBaseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_invDynBaseAcc = convertInertialAccelerationToBodyFixedAcceleration(zeroBaseAcc,pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_invDynBaseAcc = convertMixedAccelerationToBodyFixedAcceleration(zeroBaseAcc,
                                                                                 pimpl->m_vel.baseVel(),
                                                                                 pimpl->m_pos.worldBasePos().getRotation());
    }

    pimpl->m_invDynGeneralizedProperAccs.baseAcc() = pimpl->m_invDynBaseAcc;
    toEigen(pimpl->m_invDynGeneralizedProperAccs.baseAcc().getLinearVec3()) =
            toEigen(pimpl->m_invDynBaseAcc.getLinearVec3()) - toEigen(pimpl->m_gravityAccInBaseLinkFrame);
    pimpl->m_invDynGeneralizedProperAccs.jointAcc().zero();

    // Run inverse dynamics
    ForwardAccKinematics(pimpl->m_robot_model,
                         pimpl->m_traversal,
                         pimpl->m_pos,
                         pimpl->m_vel,
                         pimpl->m_invDynGeneralizedProperAccs,
                         pimpl->m_linkVel,
                         pimpl->m_invDynLinkProperAccs);

    RNEADynamicPhase(pimpl->m_robot_model,
                     pimpl->m_traversal,
                     pimpl->m_pos.jointPos(),
                     pimpl->m_linkVel,
                     pimpl->m_invDynLinkProperAccs,
                     pimpl->m_invDynNetExtWrenches,
                     pimpl->m_invDynInternalWrenches,
                     generalizedBiasForces);

    // Convert output base force
    generalizedBiasForces.baseWrench() = pimpl->fromBodyFixedToUsedRepresentation(generalizedBiasForces.baseWrench(),
                                                                           pimpl->m_linkPos(pimpl->m_traversal.getBaseLink()->getIndex()));

    return true;
}